

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O2

bool __thiscall QMimeData::hasText(QMimeData *this)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  textPlainLiteral();
  iVar2 = (*(this->super_QObject)._vptr_QObject[0xc])(this,&local_38);
  bVar1 = true;
  if ((char)iVar2 == '\0') {
    textPlainUtf8Literal();
    iVar2 = (*(this->super_QObject)._vptr_QObject[0xc])(this,&local_50);
    bVar1 = true;
    if ((char)iVar2 == '\0') {
      bVar1 = hasUrls(this);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMimeData::hasText() const
{
    return hasFormat(textPlainLiteral()) || hasFormat(textPlainUtf8Literal()) || hasUrls();
}